

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O2

int http_proxy_io_close(CONCRETE_IO_HANDLE http_proxy_io,ON_IO_CLOSE_COMPLETE on_io_close_complete,
                       void *on_io_close_complete_context)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (http_proxy_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar3 = 0x316;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x316;
    }
    pcVar4 = "NULL http_proxy_io.";
    iVar1 = 0x317;
  }
  else {
    iVar3 = *http_proxy_io;
    if (iVar3 - 1U < 2) {
      *(undefined4 *)http_proxy_io = 0;
      xio_close(*(XIO_HANDLE *)((long)http_proxy_io + 0x78),(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
      (**(code **)((long)http_proxy_io + 0x28))(*(undefined8 *)((long)http_proxy_io + 0x30),3);
      return 0;
    }
    if ((iVar3 == 4) || (iVar3 == 0)) {
      p_Var2 = xlogging_get_log_function();
      iVar3 = 0x322;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x322;
      }
      pcVar4 = "Invalid tlsio_state. Expected state is HTTP_PROXY_IO_STATE_OPEN.";
      iVar1 = 0x323;
    }
    else {
      *(undefined4 *)http_proxy_io = 4;
      *(ON_IO_CLOSE_COMPLETE *)((long)http_proxy_io + 0x38) = on_io_close_complete;
      *(void **)((long)http_proxy_io + 0x40) = on_io_close_complete_context;
      iVar1 = xio_close(*(XIO_HANDLE *)((long)http_proxy_io + 0x78),on_underlying_io_close_complete,
                        http_proxy_io);
      if (iVar1 == 0) {
        return 0;
      }
      *(int *)http_proxy_io = iVar3;
      p_Var2 = xlogging_get_log_function();
      iVar3 = 0x33e;
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return 0x33e;
      }
      pcVar4 = "Cannot close underlying IO.";
      iVar1 = 0x340;
    }
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
            ,"http_proxy_io_close",iVar1,1,pcVar4);
  return iVar3;
}

Assistant:

static int http_proxy_io_close(CONCRETE_IO_HANDLE http_proxy_io, ON_IO_CLOSE_COMPLETE on_io_close_complete, void* on_io_close_complete_context)
{
    int result = 0;

    /* Codes_SRS_HTTP_PROXY_IO_01_052: [ on_io_close_complete_context shall be allowed to be NULL. ]*/
    /* Codes_SRS_HTTP_PROXY_IO_01_028: [ on_io_close_complete shall be allowed to be NULL. ]*/
    if (http_proxy_io == NULL)
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_023: [ If the argument http_proxy_io is NULL, http_proxy_io_close shall fail and return a non-zero value. ]*/
        result = __LINE__;
        LogError("NULL http_proxy_io.");
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)http_proxy_io;

        /* Codes_SRS_HTTP_PROXY_IO_01_027: [ If http_proxy_io_close is called when not open, http_proxy_io_close shall fail and return a non-zero value. ]*/
        if ((http_proxy_io_instance->http_proxy_io_state == HTTP_PROXY_IO_STATE_CLOSED) ||
            /* Codes_SRS_HTTP_PROXY_IO_01_054: [ http_proxy_io_close while OPENING shall fail and return a non-zero value. ]*/
            (http_proxy_io_instance->http_proxy_io_state == HTTP_PROXY_IO_STATE_CLOSING))
        {
            result = __LINE__;
            LogError("Invalid tlsio_state. Expected state is HTTP_PROXY_IO_STATE_OPEN.");
        }
        else if ((http_proxy_io_instance->http_proxy_io_state == HTTP_PROXY_IO_STATE_OPENING_UNDERLYING_IO) ||
            (http_proxy_io_instance->http_proxy_io_state == HTTP_PROXY_IO_STATE_WAITING_FOR_CONNECT_RESPONSE))
        {
            /* Codes_SRS_HTTP_PROXY_IO_01_053: [ http_proxy_io_close while OPENING shall trigger the on_io_open_complete callback with IO_OPEN_CANCELLED. ]*/
            http_proxy_io_instance->http_proxy_io_state = HTTP_PROXY_IO_STATE_CLOSED;
            (void)xio_close(http_proxy_io_instance->underlying_io, NULL, NULL);
            http_proxy_io_instance->on_io_open_complete(http_proxy_io_instance->on_io_open_complete_context, IO_OPEN_CANCELLED);

            /* Codes_SRS_HTTP_PROXY_IO_01_022: [ http_proxy_io_close shall close the HTTP proxy IO and on success it shall return 0. ]*/
            result = 0;
        }
        else
        {
            HTTP_PROXY_IO_STATE previous_state = http_proxy_io_instance->http_proxy_io_state;

            http_proxy_io_instance->http_proxy_io_state = HTTP_PROXY_IO_STATE_CLOSING;

            /* Codes_SRS_HTTP_PROXY_IO_01_026: [ The on_io_close_complete and on_io_close_complete_context arguments shall be saved for later use. ]*/
            http_proxy_io_instance->on_io_close_complete = on_io_close_complete;
            http_proxy_io_instance->on_io_close_complete_context = on_io_close_complete_context;

            /* Codes_SRS_HTTP_PROXY_IO_01_024: [ http_proxy_io_close shall close the underlying IO by calling xio_close on the IO handle create in http_proxy_io_create, while passing to it the on_underlying_io_close_complete callback. ]*/
            if (xio_close(http_proxy_io_instance->underlying_io, on_underlying_io_close_complete, http_proxy_io_instance) != 0)
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_025: [ If xio_close fails, http_proxy_io_close shall fail and return a non-zero value. ]*/
                result = __LINE__;
                http_proxy_io_instance->http_proxy_io_state = previous_state;
                LogError("Cannot close underlying IO.");
            }
            else
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_022: [ http_proxy_io_close shall close the HTTP proxy IO and on success it shall return 0. ]*/
                result = 0;
            }
        }
    }

    return result;
}